

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_scale_rows(Integer g_a,Integer g_v)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  int iVar4;
  Integer IVar5;
  Integer type;
  int iVar6;
  Integer IVar7;
  void *buf;
  long *plVar8;
  undefined1 (*pauVar9) [16];
  int *piVar10;
  float *pfVar11;
  double *pdVar12;
  char *pcVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  long lVar16;
  bool bVar17;
  Integer hi [2];
  Integer lo [2];
  char *ptr;
  Integer ld;
  long local_388;
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer local_360;
  Integer vlo;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  
  pnga_nodeid();
  iVar4 = _ga_sync_end;
  bVar17 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar17) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_scale_rows_");
  pnga_check_handle(g_v,"ga_scale_rows_");
  pnga_inquire(g_a,&atype,&andim,adims);
  type = atype;
  pnga_inquire(g_v,&vtype,&vndim,&vdims);
  if (andim != 2) {
    pnga_error("ga_scale_rows_: wrong dimension for g_a.",andim);
  }
  if (vndim != 1) {
    pnga_error("ga_scale_rows_: wrong dimension for g_v.",vndim);
  }
  if (vdims != adims[0]) {
    pnga_error("ga_scale_rows_: The size of the scalar array is not the same as the number of the rows of g_a."
               ,vdims);
  }
  if (vtype != atype) {
    pnga_error("ga_scale_rows_: input global arrays do not have the same data type. Global array type ="
               ,atype);
  }
  pnga_local_iterator_init(g_a,&hdl);
  local_388 = type + -0x3e9;
  while (iVar6 = pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld), IVar5 = ld,
        pauVar9 = (undefined1 (*) [16])ptr, iVar6 != 0) {
    if ((0 < lo[0]) && (lVar16 = hi[0] - lo[0], lo[0] <= hi[0])) {
      vlo = lo[0];
      local_360 = hi[0];
      IVar7 = GAsizeof(type);
      buf = malloc((lVar16 + 1) * IVar7);
      if (buf == (void *)0x0) {
        pnga_error("ga_scale_rows_:failed to allocate memory for the local buffer.",0);
      }
      pnga_get(g_v,&vlo,&local_360,buf,&local_360);
      switch(local_388) {
      case 0:
        for (lVar16 = 0; lVar16 <= hi[0] - lo[0]; lVar16 = lVar16 + 1) {
          piVar10 = (int *)pauVar9;
          for (lVar15 = 0; lVar15 <= hi[1] - lo[1]; lVar15 = lVar15 + 1) {
            *piVar10 = *piVar10 * *(int *)((long)buf + lVar16 * 4);
            piVar10 = piVar10 + IVar5;
          }
          pauVar9 = (undefined1 (*) [16])((long)pauVar9 + 4);
        }
        break;
      case 1:
        for (lVar16 = 0; lVar16 <= hi[0] - lo[0]; lVar16 = lVar16 + 1) {
          plVar8 = (long *)pauVar9;
          for (lVar15 = 0; lVar15 <= hi[1] - lo[1]; lVar15 = lVar15 + 1) {
            *plVar8 = *plVar8 * *(long *)((long)buf + lVar16 * 8);
            plVar8 = plVar8 + IVar5;
          }
          pauVar9 = (undefined1 (*) [16])((long)pauVar9 + 8);
        }
        break;
      case 2:
        for (lVar16 = 0; lVar16 <= hi[0] - lo[0]; lVar16 = lVar16 + 1) {
          pfVar11 = (float *)pauVar9;
          for (lVar15 = 0; lVar15 <= hi[1] - lo[1]; lVar15 = lVar15 + 1) {
            *pfVar11 = *(float *)((long)buf + lVar16 * 4) * *pfVar11;
            pfVar11 = pfVar11 + IVar5;
          }
          pauVar9 = (undefined1 (*) [16])((long)pauVar9 + 4);
        }
        break;
      case 3:
        for (lVar16 = 0; lVar16 <= hi[0] - lo[0]; lVar16 = lVar16 + 1) {
          pdVar12 = (double *)pauVar9;
          for (lVar15 = 0; lVar15 <= hi[1] - lo[1]; lVar15 = lVar15 + 1) {
            *pdVar12 = *(double *)((long)buf + lVar16 * 8) * *pdVar12;
            pdVar12 = pdVar12 + IVar5;
          }
          pauVar9 = (undefined1 (*) [16])((long)pauVar9 + 8);
        }
        break;
      default:
        pnga_error("ga_scale_rows_: wrong data type:",type);
        break;
      case 5:
        for (lVar16 = 0; lVar16 <= hi[0] - lo[0]; lVar16 = lVar16 + 1) {
          pcVar13 = (char *)pauVar9;
          for (lVar15 = 0; lVar15 <= hi[1] - lo[1]; lVar15 = lVar15 + 1) {
            uVar1 = *(undefined8 *)((long)buf + lVar16 * 8);
            *(ulong *)pcVar13 =
                 CONCAT44((float)((ulong)*(undefined8 *)pcVar13 >> 0x20) *
                          (float)((ulong)uVar1 >> 0x20),(float)*(undefined8 *)pcVar13 * (float)uVar1
                         );
            pcVar13 = pcVar13 + IVar5 * 8;
          }
          pauVar9 = (undefined1 (*) [16])((long)pauVar9 + 8);
        }
        break;
      case 6:
        for (lVar16 = 0; lVar16 <= hi[0] - lo[0]; lVar16 = lVar16 + 1) {
          pdVar12 = (double *)(lVar16 * 0x10 + (long)buf);
          pauVar14 = pauVar9;
          for (lVar15 = 0; lVar15 <= hi[1] - lo[1]; lVar15 = lVar15 + 1) {
            dVar3 = *(double *)(*pauVar14 + 8) * pdVar12[1];
            auVar2._8_4_ = SUB84(dVar3,0);
            auVar2._0_8_ = *(double *)*pauVar14 * *pdVar12;
            auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
            *pauVar14 = auVar2;
            pauVar14 = pauVar14 + IVar5;
          }
          pauVar9 = pauVar9 + 1;
        }
      }
      free(buf);
    }
  }
  if (iVar4 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_scale_rows(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1/*, dim2*/, vtype, atype, type;
  Integer ld, lo[2], hi[2];
  Integer me = pnga_nodeid (), i, chk;
  char *ptr;
  Integer andim, adims[2];
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_scale_rows_");
  pnga_check_handle (g_v, "ga_scale_rows_");

  pnga_inquire (g_a, &atype, &andim, adims);
  dim1 = adims[0];
  /*dim2 = adims[1];*/
  type = atype;
  pnga_inquire (g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_scale_rows_: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_scale_rows_: wrong dimension for g_v.", vndim);

  /*in internal functions, dim1 = number of rows of the matrix g_a*/
  /*in internal functions, dim2 = number of columns of the matrix g_a*/
  if (vdims != dim1)
    pnga_error
      ("ga_scale_rows_: The size of the scalar array is not the same as the number of the rows of g_a.",
       vdims);

  if (vtype != atype)
  {
    pnga_error
      ("ga_scale_rows_: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_scale_row_values(type, lo, hi, ld, ptr, g_v);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution (g_a, me, lo, hi);

    chk = 1;
    for (i=0; i<andim; i++) {
      if (lo[i]>hi[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr (g_a, lo, hi, &ptr, &ld);

      sgai_scale_row_values(type, lo, hi, ld, ptr, g_v);

      /* release access to the data */
      pnga_release_update (g_a, lo, hi);
    }
  } else {
    Integer nproc = pnga_nnodes();
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      Integer idx;
      for (idx=me; idx<num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_scale_row_values(type, lo, hi, ld, ptr, g_v);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);

      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > adims[i]) hi[i] = adims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_scale_row_values(type, lo, hi, ld, ptr, g_v);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}